

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall
cppnet::Dispatcher::Connect::anon_class_48_3_02cd77fa::operator()(anon_class_48_3_02cd77fa *this)

{
  Dispatcher *pDVar1;
  shared_ptr<cppnet::RWSocket> sock;
  long *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_40;
  __weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pDVar1 = this->this;
  MakeRWSocket();
  std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::Dispatcher,void>
            ((__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> *)
             &pDVar1->super_enable_shared_from_this<cppnet::Dispatcher>);
  std::__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0xc),&local_50
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__weak_ptr<cppnet::EventActions,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cppnet::EventActions,void>
            ((__weak_ptr<cppnet::EventActions,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             &(pDVar1->_event_actions).
              super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 10),
             &local_30);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&pDVar1->_cppnet_base);
  std::__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8),&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (**(code **)(*local_60 + 0x48))(local_60,this,this->port);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}